

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall xmrig::Worker::Worker(Worker *this,size_t id,int64_t affinity,int priority)

{
  uint32_t uVar1;
  _func_int **in_RDX;
  _func_int **in_RSI;
  IWorker *in_RDI;
  __integral_type in_stack_ffffffffffffffb8;
  atomic<unsigned_long> *this_00;
  int priority_00;
  
  IWorker::IWorker(in_RDI);
  in_RDI->_vptr_IWorker = (_func_int **)&PTR__Worker_002b7c20;
  in_RDI[1]._vptr_IWorker = in_RDX;
  in_RDI[2]._vptr_IWorker = in_RSI;
  this_00 = (atomic<unsigned_long> *)0x0;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)0x0,in_stack_ffffffffffffffb8);
  std::atomic<unsigned_long>::atomic(this_00,in_stack_ffffffffffffffb8);
  priority_00 = (int)((ulong)this_00 >> 0x20);
  *(undefined4 *)&in_RDI[5]._vptr_IWorker = 0;
  in_RDI[6]._vptr_IWorker = (_func_int **)0x0;
  uVar1 = VirtualMemory::bindToNUMANode((int64_t)in_RDI);
  *(uint32_t *)&in_RDI[5]._vptr_IWorker = uVar1;
  Platform::trySetThreadAffinity(in_stack_ffffffffffffffb8);
  Platform::setThreadPriority(priority_00);
  return;
}

Assistant:

xmrig::Worker::Worker(size_t id, int64_t affinity, int priority) :
    m_affinity(affinity),
    m_id(id),
    m_hashCount(0),
    m_timestamp(0)
{
    m_node = VirtualMemory::bindToNUMANode(affinity);

    Platform::trySetThreadAffinity(affinity);
    Platform::setThreadPriority(priority);
}